

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O3

json __thiscall
helics::BaseTimeCoordinator::grantTimeoutCheck_abi_cxx11_
          (BaseTimeCoordinator *this,ActionMessage *cmd)

{
  ushort uVar1;
  long lVar2;
  long lVar3;
  long in_RDX;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar4;
  json jVar5;
  
  lVar3._0_4_ = cmd->source_id;
  lVar3._4_4_ = cmd->source_handle;
  lVar2._0_4_ = cmd->dest_id;
  lVar2._4_4_ = cmd->dest_handle;
  if (lVar3 != lVar2) {
    uVar1 = *(ushort *)(in_RDX + 0x18);
    do {
      if ((*(int *)(lVar3 + 0x48) == *(int *)(in_RDX + 8)) &&
         (*(uint *)(lVar3 + 0x38) = (uint)uVar1, uVar1 == 6)) {
        *(undefined1 *)&this->_vptr_BaseTimeCoordinator = 0;
        (this->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (**(code **)(*(long *)cmd + 0x60))(cmd,this);
        jVar4 = extraout_RDX_00;
        goto LAB_00362256;
      }
      lVar3 = lVar3 + 0x58;
    } while (lVar3 != lVar2);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this,(initializer_list_t)ZEXT816(0),false,object);
  jVar4 = extraout_RDX;
LAB_00362256:
  jVar5.m_data.m_value.object = jVar4.object;
  jVar5.m_data._0_8_ = this;
  return (json)jVar5.m_data;
}

Assistant:

nlohmann::json BaseTimeCoordinator::grantTimeoutCheck(const ActionMessage& cmd)
{
    for (auto& dep : dependencies) {
        if (dep.fedID == cmd.source_id) {
            dep.timeoutCount = cmd.counter;
            if (cmd.counter == 6) {
                nlohmann::json base;
                generateDebuggingTimeInfo(base);
                return base;
            }
        }
    }
    return nlohmann::json::object();
}